

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_checkPiTarget(ENCODING *enc,char *ptr,char *end,int *tokPtr)

{
  bool bVar1;
  int iVar2;
  char cVar3;
  
  end[0] = '\v';
  end[1] = '\0';
  end[2] = '\0';
  end[3] = '\0';
  iVar2 = 1;
  if ((long)ptr - (long)enc == 6) {
    cVar3 = -1;
    if (*(char *)((long)enc->scanners + 1) == '\0') {
      cVar3 = *(char *)enc->scanners;
    }
    if (cVar3 == 'x') {
      bVar1 = false;
    }
    else {
      if (cVar3 != 'X') {
        return 1;
      }
      bVar1 = true;
    }
    cVar3 = -1;
    if (*(char *)((long)enc->scanners + 3) == '\0') {
      cVar3 = *(char *)((long)enc->scanners + 2);
    }
    if (cVar3 != 'm') {
      if (cVar3 != 'M') {
        return 1;
      }
      bVar1 = true;
    }
    cVar3 = -1;
    if (*(char *)((long)enc->scanners + 5) == '\0') {
      cVar3 = *(char *)((long)enc->scanners + 4);
    }
    if (cVar3 != 'l') {
      if (cVar3 != 'L') {
        return 1;
      }
      bVar1 = true;
    }
    iVar2 = 0;
    if (!bVar1) {
      end[0] = '\f';
      end[1] = '\0';
      end[2] = '\0';
      end[3] = '\0';
      return 1;
    }
  }
  return iVar2;
}

Assistant:

static int PTRCALL
PREFIX(checkPiTarget)(const ENCODING *enc, const char *ptr, const char *end,
                      int *tokPtr) {
  int upper = 0;
  UNUSED_P(enc);
  *tokPtr = XML_TOK_PI;
  if (end - ptr != MINBPC(enc) * 3)
    return 1;
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_x:
    break;
  case ASCII_X:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_m:
    break;
  case ASCII_M:
    upper = 1;
    break;
  default:
    return 1;
  }
  ptr += MINBPC(enc);
  switch (BYTE_TO_ASCII(enc, ptr)) {
  case ASCII_l:
    break;
  case ASCII_L:
    upper = 1;
    break;
  default:
    return 1;
  }
  if (upper)
    return 0;
  *tokPtr = XML_TOK_XML_DECL;
  return 1;
}